

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O0

bool __thiscall
tinyusdz::Stage::compute_absolute_prim_path_and_assign_prim_id
          (Stage *this,bool force_assign_prim_id)

{
  bool bVar1;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *this_00;
  reference prim;
  Prim *root;
  iterator __end1;
  iterator __begin1;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *__range1;
  string local_138;
  allocator local_111;
  string local_110;
  undefined1 local_f0 [8];
  Path rootPath;
  bool force_assign_prim_id_local;
  Stage *this_local;
  
  rootPath._207_1_ = force_assign_prim_id;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_110,"/",&local_111);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_138,"",(allocator *)((long)&__range1 + 7));
  Path::Path((Path *)local_f0,&local_110,&local_138);
  ::std::__cxx11::string::~string((string *)&local_138);
  ::std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  ::std::__cxx11::string::~string((string *)&local_110);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_111);
  this_00 = root_prims(this);
  __end1._M_current =
       (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::begin(this_00);
  root = (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::end(this_00);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
                                *)&root);
    if (!bVar1) {
      this->_prim_id_dirty = true;
      this_local._7_1_ = true;
LAB_004770bc:
      Path::~Path((Path *)local_f0);
      return this_local._7_1_;
    }
    prim = __gnu_cxx::
           __normal_iterator<tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
           ::operator*(&__end1);
    bVar1 = anon_unknown_28::ComputeAbsPathAndAssignPrimIdRec
                      (this,prim,(Path *)local_f0,1,true,(bool)(rootPath._207_1_ & 1),&this->_err);
    if (!bVar1) {
      this_local._7_1_ = false;
      goto LAB_004770bc;
    }
    __gnu_cxx::
    __normal_iterator<tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool Stage::compute_absolute_prim_path_and_assign_prim_id(
    bool force_assign_prim_id) {
  Path rootPath("/", "");
  for (Prim &root : root_prims()) {
    if (!ComputeAbsPathAndAssignPrimIdRec(*this, root, rootPath, 1,
                                          /* assign_prim_id */ true,
                                          force_assign_prim_id, &_err)) {
      return false;
    }
  }

  // TODO: Only set dirty when prim_id changed.
  _prim_id_dirty = true;

  return true;
}